

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O0

void __thiscall tsp::Chromosome::Chromosome(Chromosome *this,Region *region)

{
  unsigned_long uVar1;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint v;
  uint size;
  Region *local_18;
  Region *region_local;
  Chromosome *this_local;
  
  local_18 = region;
  region_local = &this->region;
  Region::Region(&this->region);
  std::vector<int,_std::allocator<int>_>::vector(&this->values);
  memset(&v,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->values,(vector<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&v);
  uVar1 = Region::countCities(local_18);
  local_34 = (uint)uVar1;
  for (local_38 = 1; local_38 <= local_34; local_38 = local_38 + 1) {
    local_3c = local_38;
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->values,(value_type_conflict *)&local_3c);
  }
  Region::operator=(&this->region,local_18);
  return;
}

Assistant:

Chromosome::Chromosome(tsp::Region &region) {
        this->values = std::vector<int>();
        uint size = region.countCities();

        for (uint v = 1; v <= size; v++) {
            this->values.push_back(v);
        }

        this->region = region;
    }